

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall llvm::detail::IEEEFloat::modSpecials(IEEEFloat *this,IEEEFloat *rhs)

{
  uint uVar1;
  opStatus oVar2;
  
  uVar1 = ((byte)rhs->field_0x12 & 7) + ((byte)this->field_0x12 & 7) * 4;
  if (uVar1 < 0x10) {
    oVar2 = opOK;
    if ((22000U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x880dU >> (uVar1 & 0x1f) & 1) == 0) {
        this->field_0x12 = (this->field_0x12 & 0xf0) + 1;
        copySignificand(this,rhs);
        oVar2 = opOK;
      }
      else {
        makeNaN(this,false,false,(APInt *)0x0);
        oVar2 = opInvalidOp;
      }
    }
    return oVar2;
  }
  llvm_unreachable_internal
            ((char *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
             ,0x638);
}

Assistant:

IEEEFloat::opStatus IEEEFloat::modSpecials(const IEEEFloat &rhs) {
  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcNormal):
  case PackCategoriesIntoKey(fcNormal, fcInfinity):
    return opOK;

  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    sign = false;
    category = fcNaN;
    copySignificand(rhs);
    return opOK;

  case PackCategoriesIntoKey(fcNormal, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcZero):
    makeNaN();
    return opInvalidOp;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    return opOK;
  }
}